

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disabled_disk_io.cpp
# Opt level: O2

void __thiscall
libtorrent::disabled_disk_io::async_read
          (disabled_disk_io *this,storage_index_t param_1,peer_request *r,
          function<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&)>
          *handler,disk_job_flags_t param_4)

{
  io_context *ctx;
  _Manager_type p_Var1;
  type local_38;
  
  ctx = this->m_ios;
  local_38.h.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_38.h.super__Function_base._M_functor._8_8_ = 0;
  local_38.h.super__Function_base._M_manager = (_Manager_type)0x0;
  local_38.h._M_invoker = handler->_M_invoker;
  p_Var1 = (handler->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_38.h.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(handler->super__Function_base)._M_functor;
    local_38.h.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)((long)&(handler->super__Function_base)._M_functor + 8);
    (handler->super__Function_base)._M_manager = (_Manager_type)0x0;
    handler->_M_invoker = (_Invoker_type)0x0;
    local_38.h.super__Function_base._M_manager = p_Var1;
  }
  local_38.this = this;
  boost::asio::
  post<boost::asio::io_context,libtorrent::disabled_disk_io::async_read(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::peer_request_const&,std::function<void(libtorrent::disk_buffer_holder,libtorrent::storage_error_const&)>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_job_flags_tag,void>)::_lambda()_1_>
            (ctx,&local_38,(type *)0x0);
  ::std::_Function_base::~_Function_base(&local_38.h.super__Function_base);
  return;
}

Assistant:

void async_read(storage_index_t, peer_request const& r
		, std::function<void(disk_buffer_holder, storage_error const&)> handler
		, disk_job_flags_t) override
	{
		TORRENT_ASSERT(r.length <= default_block_size);
		TORRENT_UNUSED(r);

		post(m_ios, [this, h = std::move(handler)] {
			h(disk_buffer_holder(*this, this->m_zero_buffer.get(), default_block_size)
				, storage_error{});
		});
	}